

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O0

void __thiscall duckdb::CSVReaderOptions::SetDelimiter(CSVReaderOptions *this,string *input)

{
  ulong uVar1;
  InvalidInputException *this_00;
  string *in_RSI;
  string delim_str;
  string *in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  undefined1 by_user;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  allocator *paVar2;
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  string local_f8 [38];
  undefined1 local_d2;
  allocator local_d1;
  string local_d0 [24];
  string *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  allocator local_71;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  by_user = (undefined1)((ulong)in_stack_fffffffffffffee0 >> 0x38);
  ::std::__cxx11::string::string(local_50,in_RSI);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_70,"\\t",&local_71);
  this_01 = (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&stack0xffffffffffffff57;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff58,anon_var_dwarf_3eb6817 + 7,(allocator *)this_01);
  StringUtil::Replace(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48)
  ;
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  ::std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
  ::std::__cxx11::string::~string(local_70);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  ::std::__cxx11::string::~string(local_50);
  uVar1 = ::std::__cxx11::string::size();
  if (4 < uVar1) {
    local_d2 = 1;
    this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    paVar2 = &local_d1;
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_d0,"The delimiter option cannot exceed a size of 4 bytes.",paVar2);
    InvalidInputException::InvalidInputException(this_00,in_stack_fffffffffffffed8);
    local_d2 = 0;
    __cxa_throw(this_00,&InvalidInputException::typeinfo,
                InvalidInputException::~InvalidInputException);
  }
  ::std::__cxx11::string::string(local_f8,local_30);
  CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::Set
            (this_01,in_stack_fffffffffffffee8,(bool)by_user);
  ::std::__cxx11::string::~string(local_f8);
  ::std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void CSVReaderOptions::SetDelimiter(const string &input) {
	auto delim_str = StringUtil::Replace(input, "\\t", "\t");
	if (delim_str.size() > 4) {
		throw InvalidInputException("The delimiter option cannot exceed a size of 4 bytes.");
	}
	this->dialect_options.state_machine_options.delimiter.Set(delim_str);
}